

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O2

bool __thiscall osQueue::Put(osQueue *this,void *item)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  osMutex::Take(&this->Lock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0x71);
  iVar1 = this->MaxElements;
  iVar2 = this->ElementCount;
  if (iVar2 < iVar1) {
    iVar3 = this->NextInIndex + 1;
    iVar4 = 0;
    if (iVar3 < iVar1) {
      iVar4 = iVar3;
    }
    this->Array[this->NextInIndex] = item;
    this->NextInIndex = iVar4;
    this->ElementCount = iVar2 + 1;
  }
  osMutex::Give(&this->Lock);
  return iVar2 < iVar1;
}

Assistant:

bool osQueue::Put(void* item)
{
    int next;
    bool rc = true;

    Lock.Take(__FILE__, __LINE__);

    next = Increment(NextInIndex);
    if (ElementCount >= MaxElements)
    {
        // Queue is full, so don't add item
        rc = false;
    }
    else
    {
        Array[NextInIndex] = item;
        NextInIndex = next;
        ElementCount++;
    }

    Lock.Give();
    return rc;
}